

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

bool __thiscall
dap::Deserializer::
deserialize<std::vector<dap::ColumnDescriptor,std::allocator<dap::ColumnDescriptor>>>
          (Deserializer *this,
          optional<std::vector<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>_> *opt
          )

{
  bool bVar1;
  undefined1 local_30 [8];
  vector<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_> v;
  optional<std::vector<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>_> *opt_local;
  Deserializer *this_local;
  
  v.super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)opt;
  std::vector<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>::vector
            ((vector<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_> *)local_30);
  bVar1 = deserialize<dap::ColumnDescriptor>
                    (this,(vector<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_> *)
                          local_30);
  if (bVar1) {
    optional<std::vector<dap::ColumnDescriptor,std::allocator<dap::ColumnDescriptor>>>::operator=
              ((optional<std::vector<dap::ColumnDescriptor,std::allocator<dap::ColumnDescriptor>>> *
               )v.super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_> *)local_30);
  }
  std::vector<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>::~vector
            ((vector<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_> *)local_30);
  return true;
}

Assistant:

bool Deserializer::deserialize(dap::optional<T>* opt) const {
  T v;
  if (deserialize(&v)) {
    *opt = v;
  }
  return true;
}